

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3StrAccumSetError(StrAccum *p,u8 eError)

{
  p->accError = eError;
  if (p->mxAlloc != 0) {
    sqlite3_str_reset(p);
  }
  if (eError == '\x12') {
    sqlite3ErrorToParser(p->db,0x12);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3StrAccumSetError(StrAccum *p, u8 eError){
  assert( eError==SQLITE_NOMEM || eError==SQLITE_TOOBIG );
  p->accError = eError;
  if( p->mxAlloc ) sqlite3_str_reset(p);
  if( eError==SQLITE_TOOBIG ) sqlite3ErrorToParser(p->db, eError);
}